

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int collision(tgestate_t *state)

{
  ushort uVar1;
  ushort uVar2;
  byte bVar3;
  tgestate_t *in_RDI;
  uint16_t *pcoord;
  uint16_t new_direction;
  uint8_t direction;
  uint8_t input;
  uint8_t centre;
  uint8_t range;
  character_t character;
  uint8_t coord;
  int8_t delta;
  uint16_t saved_v;
  uint16_t saved_u;
  uint16_t v;
  uint16_t u;
  uint8_t iters;
  vischar_t *vischar;
  movableitem_t *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  byte local_27;
  char local_23;
  char local_19;
  vischar_t *local_18;
  
  local_18 = in_RDI->vischars;
  local_19 = '\b';
  do {
    if ((local_18->flags & 0x80) == 0) {
      uVar1 = (local_18->mi).mappos.u;
      uVar2 = (in_RDI->saved_mappos).pos16.u;
      if (((uint)uVar2 == uVar1 + 4) ||
         (((uint)uVar2 <= uVar1 + 4 && ((int)(uVar1 - 4) <= (int)(uint)uVar2)))) {
        uVar1 = (local_18->mi).mappos.v;
        uVar2 = (in_RDI->saved_mappos).pos16.v;
        if (((uint)uVar2 == uVar1 + 4) ||
           (((uint)uVar2 <= uVar1 + 4 && ((int)(uVar1 - 4) <= (int)(uint)uVar2)))) {
          local_23 = (char)(in_RDI->saved_mappos).pos16.w - (char)(local_18->mi).mappos.w;
          if (local_23 < '\0') {
            local_23 = -local_23;
          }
          if (local_23 < '\x18') {
            if (((in_RDI->IY->flags & 0xf) == 1) && (local_18 == in_RDI->vischars)) {
              if (in_RDI->IY->character != in_RDI->bribed_character) {
                solitary(in_RDI);
                return 0;
              }
              accept_bribe((tgestate_t *)
                           CONCAT17(in_stack_ffffffffffffffd7,
                                    CONCAT16(in_stack_ffffffffffffffd6,
                                             CONCAT24(in_stack_ffffffffffffffd4,
                                                      in_stack_ffffffffffffffd0))));
            }
            if (0x19 < local_18->character) {
              local_38 = (movableitem_t *)&(local_18->mi).mappos.v;
              local_27 = 0x23;
              bVar3 = in_RDI->IY->direction;
              if (local_18->character == 0x1c) {
                local_38 = &local_18->mi;
                local_27 = 0x36;
                bVar3 = bVar3 ^ 1;
              }
              switch(bVar3) {
              case 0:
                bVar3 = (byte)(local_38->mappos).u;
                if (bVar3 != local_27) {
                  if (local_27 < bVar3) {
                    (local_38->mappos).u = (local_38->mappos).u - 1;
                  }
                  else {
                    (local_38->mappos).u = (local_38->mappos).u + 1;
                  }
                }
                break;
              case 1:
                if ((local_38->mappos).u != (uint16_t)(local_27 + 7)) {
                  (local_38->mappos).u = (local_38->mappos).u + 1;
                }
                break;
              case 2:
                (local_38->mappos).u = local_27 - 7;
                break;
              case 3:
                if ((uint)(local_38->mappos).u != local_27 - 7) {
                  (local_38->mappos).u = (local_38->mappos).u - 1;
                }
              }
            }
            if (((local_18->input & 0x7f) == 0) ||
               ((local_18->direction ^ 2) == in_RDI->IY->direction)) {
              bVar3 = in_RDI->IY->direction;
              in_RDI->IY->input = collision::new_inputs[bVar3 & 3];
              if ((bVar3 & 1) == 0) {
                in_RDI->IY->counter_and_flags = in_RDI->IY->counter_and_flags & 0xdf;
              }
              else {
                in_RDI->IY->counter_and_flags = in_RDI->IY->counter_and_flags | 0x20;
              }
            }
            else {
              in_RDI->IY->input = 0x80;
            }
            in_RDI->IY->counter_and_flags = in_RDI->IY->counter_and_flags & 0xf0 | 5;
            return 1;
          }
        }
      }
    }
    local_18 = local_18 + 1;
    local_19 = local_19 + -1;
    if (local_19 == '\0') {
      return 0;
    }
  } while( true );
}

Assistant:

int collision(tgestate_t *state)
{
  vischar_t  *vischar;        /* was HL */
  uint8_t     iters;          /* was B */
  uint16_t    u;              /* was BC */
  uint16_t    v;              /* was BC */
  uint16_t    saved_u;        /* was HL */
  uint16_t    saved_v;        /* was HL */
  int8_t      delta;          /* was A */
  uint8_t     coord;          /* was A */
  character_t character;      /* was A */
  uint8_t     range;          /* was B */
  uint8_t     centre;         /* was C */
  uint8_t     input;          /* was A */
  uint8_t     direction;      /* was A */
  uint16_t    new_direction;  /* was BC */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(state->IY);

  /* Iterate over characters being collided with (e.g. stove). */
  vischar = &state->vischars[0];
  iters = vischars_LENGTH;
  do
  {
    if (vischar->flags & vischar_FLAGS_NO_COLLIDE)
      goto next;

    /* Test for contact between the current vischar and saved_mappos (which is
     * set on entry either from a vischar or a characterstruct).
     *
     * For contact to occur the vischar being tested must be positioned
     * within (-4..+4) on the x and y axis and within (-23..23) on the height
     * axis.
     */

    u = vischar->mi.mappos.u; /* Conv: Moved +4 forward. */
    saved_u = state->saved_mappos.pos16.u;
    if (saved_u != u + 4) /* redundant check */
      if (saved_u > u + 4 || saved_u < u - 4) /* Conv: Removed redundant reload. */
        goto next; /* no x collision */

    v = vischar->mi.mappos.v; /* Conv: Moved +4 forward. */
    saved_v = state->saved_mappos.pos16.v;
    if (saved_v != v + 4) /* redundant check */
      if (saved_v > v + 4 || saved_v < v - 4) /* Conv: Removed redundant reload. */
        goto next; /* no y collision */

    /* Ensure that the heights are within 24 of each other. This will stop
     * the character colliding with any guards high up in watchtowers.
     * Note: Signed result. */
    delta = state->saved_mappos.pos16.w - vischar->mi.mappos.w;
    if (delta < 0)
      delta = -delta; /* absolute value */
    if (delta >= 24)
      goto next;

    /* Check for pursuit. */


    /* If vischar IY is pursuing... */
    if ((state->IY->flags & vischar_FLAGS_PURSUIT_MASK) == vischar_PURSUIT_PURSUE)
    {
      /* ...and the current vischar is the hero... */
      if (vischar == &state->vischars[0])
      {
        if (state->IY->character == state->bribed_character)
        {
          /* Vischar IY is a bribed character pursuing the hero.
           * When the pursuer catches the hero the bribe will be accepted. */
          accept_bribe(state);
        }
        else
        {
          /* Vischar IY is a hostile who's caught the hero! */
          /* Conv: Removed "HL = IY + 1" code which has no effect. */
          solitary(state);
          NEVER_RETURNS 0;
        }
      }
    }

    /*
     * Check for collisions with items.
     */

    /* If it's an item... */
    character = vischar->character;
    if (character >= character_26_STOVE_1)
    {
      uint16_t *pcoord; /* was HL */

      /* Movable items: Stove 1, Stove 2 or Crate */

      pcoord = &vischar->mi.mappos.v;

      /* By default, setup for the stove.
       * It can move on the Y axis only (bottom left to top right). */
      range = 7; /* permitted range from centre point */
      centre = 35; /* centre point (object will move from 29 to 42) */
      direction = state->IY->direction; /* was interleaved */
      if (character == character_28_CRATE)
      {
        /* Setup for the crate.
         * It can move on the X axis only (top left to bottom right). */
        pcoord--; /* point at vischar->mi.pos.x */
        centre = 54; /* centre point (object will move from 47 to 61) */
        direction ^= 1; /* swap axis: left<=>right */
      }

      switch (direction)
      {
        case direction_TOP_LEFT:
          /* The player is pushing the movable item from its front, so centre
           * it. */
          coord = *pcoord; /* Conv: Original code loads a byte here. */
          if (coord != centre)
          {
            /* Conv: This was the [-2]+1 pattern. */
            if (coord > centre)
              (*pcoord)--;
            else
              (*pcoord)++;
          }
          break;

        case direction_TOP_RIGHT:
          if (*pcoord != (centre + range))
            (*pcoord)++;
          break;

        case direction_BOTTOM_RIGHT:
          /* Note: This case happens in the game. */
          *pcoord = centre - range;
          break;

        case direction_BOTTOM_LEFT:
          if (*pcoord != (centre - range))
            (*pcoord)--;
          break;

        default:
          assert("Should not happen" == NULL);
          break;
      }
    }

    /*
     * Check for collisions with characters.
     */

    input = vischar->input & ~input_KICK;
    if (input)
    {
      assert(input < 9); // TODO: Add an input_XXX symbol for '9'

      /* Swap direction top <=> bottom, then compare. */
      if ((vischar->direction ^ 2) != state->IY->direction)
      {
        /* The characters collided while facing away from each other. */

        state->IY->input = input_KICK; /* force an update */

collided_set_delay:
        /* Delay calling character_behaviour() for five turns. This delay
         * controls how long it takes before a blocked character will try
         * another direction. */
        state->IY->counter_and_flags = (state->IY->counter_and_flags & ~vischar_BYTE7_COUNTER_MASK) | 5;
        return 1; /* collided */
      }
    }

    /* Pick a new direction for the vischar at state->IY. */
    {
      /** $B0F8: Inputs which move the character in the next anticlockwise
       *         direction. */
      static const uint8_t new_inputs[4] =
      {
        input_DOWN + input_LEFT  + input_KICK, /* if facing TL, move D+L */
        input_UP   + input_LEFT  + input_KICK, /* if facing TR, move U+L */
        input_UP   + input_RIGHT + input_KICK, /* if facing BR, move U+R */
        input_DOWN + input_RIGHT + input_KICK  /* if facing BL, move D+R */
      };

      /* BUG FIX: Mask 'direction' so that we don't access out-of-bounds in
       * new_inputs[] if we collide when crawling. */
      new_direction = state->IY->direction & vischar_DIRECTION_MASK;
      assert(new_direction < 4);
      state->IY->input = new_inputs[new_direction];
      assert((state->IY->input & ~input_KICK) < 9);
      if ((new_direction & 1) == 0) /* if was facing TL or BR */
        state->IY->counter_and_flags &= ~vischar_BYTE7_V_DOMINANT;
      else
      state->IY->counter_and_flags |= vischar_BYTE7_V_DOMINANT;
    }

    goto collided_set_delay;

next:
    vischar++;
  }
  while (--iters);

  return 0; /* no collision */
}